

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

Error asmjit::v1_14::CodeHolder_reserveInternal(CodeHolder *self,CodeBuffer *cb,size_t n)

{
  uint uVar1;
  void *__ptr;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  size_t in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  size_t offset;
  BaseAssembler *a;
  BaseEmitter *emitter;
  const_iterator __end2;
  const_iterator __begin2;
  ZoneVector<asmjit::v1_14::BaseEmitter_*> *__range2;
  uint8_t *newData;
  uint8_t *oldData;
  long *local_90;
  void *local_80;
  Error local_54;
  
  __ptr = (void *)*in_RSI;
  if ((__ptr == (void *)0x0) ||
     (bVar5 = Support::test<asmjit::v1_14::CodeBufferFlags,asmjit::v1_14::CodeBufferFlags>
                        (*(CodeBufferFlags *)(in_RSI + 3),kIsExternal), bVar5)) {
    local_80 = malloc(in_RDX);
  }
  else {
    local_80 = realloc(__ptr,in_RDX);
  }
  if (local_80 == (void *)0x0) {
    local_54 = DebugUtils::errored(1);
  }
  else {
    *in_RSI = local_80;
    in_RSI[2] = in_RDX;
    lVar2 = *(long *)(in_RDI + 200);
    uVar1 = *(uint *)(in_RDI + 0xd0);
    for (local_90 = *(long **)(in_RDI + 200); local_90 != (long *)(lVar2 + (ulong)uVar1 * 8);
        local_90 = local_90 + 1) {
      lVar3 = *local_90;
      if ((*(char *)(lVar3 + 8) == '\x01') &&
         ((undefined8 *)(*(long *)(lVar3 + 0x90) + 0x48) == in_RSI)) {
        lVar4 = *(long *)(lVar3 + 0x98);
        *(void **)(lVar3 + 0x98) = local_80;
        *(size_t *)(lVar3 + 0xa0) = (long)local_80 + in_RDX;
        *(long *)(lVar3 + 0xa8) = (long)local_80 + (*(long *)(lVar3 + 0xa8) - lVar4);
      }
    }
    local_54 = 0;
  }
  return local_54;
}

Assistant:

static Error CodeHolder_reserveInternal(CodeHolder* self, CodeBuffer* cb, size_t n) noexcept {
  uint8_t* oldData = cb->_data;
  uint8_t* newData;

  if (oldData && !cb->isExternal())
    newData = static_cast<uint8_t*>(::realloc(oldData, n));
  else
    newData = static_cast<uint8_t*>(::malloc(n));

  if (ASMJIT_UNLIKELY(!newData))
    return DebugUtils::errored(kErrorOutOfMemory);

  cb->_data = newData;
  cb->_capacity = n;

  // Update pointers used by assemblers, if attached.
  for (BaseEmitter* emitter : self->emitters()) {
    if (emitter->isAssembler()) {
      BaseAssembler* a = static_cast<BaseAssembler*>(emitter);
      if (&a->_section->_buffer == cb) {
        size_t offset = a->offset();

        a->_bufferData = newData;
        a->_bufferEnd  = newData + n;
        a->_bufferPtr  = newData + offset;
      }
    }
  }

  return kErrorOk;
}